

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O0

void tellUserTags(vector<int,_std::allocator<int>_> *tags)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  ostream *this;
  const_iterator cStack_28;
  int t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *tags_local;
  
  std::operator<<((ostream *)&std::cout,"There are these tags: ");
  __end1 = std::vector<int,_std::allocator<int>_>::begin(tags);
  cStack_28 = std::vector<int,_std::allocator<int>_>::end(tags);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd8);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    iVar1 = *piVar3;
    this = std::operator<<((ostream *)&std::cout," ");
    std::ostream::operator<<(this,iVar1);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void tellUserTags(const std::vector<int>& tags){
    std::cout << "There are these tags: ";
    for(auto t : tags) std::cout << " " << t;
    std::cout << std::endl;
}